

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_list.hpp
# Opt level: O0

void __thiscall
beast::unit_test::suite_list::insert<jbcoin::tests::ValidatorKeysTool_test>
          (suite_list *this,char *name,char *module,char *library,bool manual)

{
  cont_type *this_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar1;
  pair<std::__detail::_Node_iterator<std::type_index,_true,_false>,_bool> pVar2;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  suite_info local_1d8;
  _Node_iterator_base<std::type_index,_false> local_150;
  undefined1 local_148;
  type_index local_140;
  _Node_iterator_base<std::type_index,_false> local_138;
  pair<std::__detail::_Node_iterator<std::type_index,_true,_false>,_bool> result_1;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  result;
  allocator local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [8];
  string s;
  bool manual_local;
  char *library_local;
  char *module_local;
  char *name_local;
  suite_list *this_local;
  
  s.field_2._M_local_buf[0xf] = manual;
  ::std::__cxx11::string::string((string *)local_50);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_f0,library,&local_f1);
  ::std::operator+(&local_d0,&local_f0,".");
  ::std::operator+(&local_b0,&local_d0,module);
  ::std::operator+(&local_90,&local_b0,".");
  ::std::operator+(&local_70,&local_90,name);
  ::std::__cxx11::string::operator=((string *)local_50,(string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_b0);
  ::std::__cxx11::string::~string((string *)&local_d0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pVar1 = ::std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&this->names_,(value_type *)local_50);
  result_1._8_8_ =
       pVar1.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __assert_fail("result.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_list.hpp"
                  ,0x3c,
                  "void beast::unit_test::suite_list::insert(const char *, const char *, const char *, bool) [Suite = jbcoin::tests::ValidatorKeysTool_test]"
                 );
  }
  ::std::__cxx11::string::~string((string *)local_50);
  ::std::type_index::type_index
            (&local_140,(type_info *)&jbcoin::tests::ValidatorKeysTool_test::typeinfo);
  pVar2 = ::std::
          unordered_set<std::type_index,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::type_index>_>
          ::insert((unordered_set<std::type_index,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::type_index>_>
                    *)&this->classes_,&local_140);
  local_150._M_cur =
       (__node_type *)pVar2.first.super__Node_iterator_base<std::type_index,_false>._M_cur;
  local_148 = pVar2.second;
  local_138._M_cur = local_150._M_cur;
  result_1.first.super__Node_iterator_base<std::type_index,_false>._M_cur._0_1_ = local_148;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    this_00 = unit_test::detail::
              const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
              ::cont(&this->
                      super_const_container<std::set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>_>
                    );
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1f8,name,&local_1f9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_220,module,&local_221);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_248,library,&local_249);
    make_suite_info<jbcoin::tests::ValidatorKeysTool_test>
              (&local_1d8,&local_1f8,&local_220,&local_248,(bool)(s.field_2._M_local_buf[0xf] & 1));
    ::std::
    set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
    ::emplace<beast::unit_test::suite_info>
              ((set<beast::unit_test::suite_info,_std::less<beast::unit_test::suite_info>,_std::allocator<beast::unit_test::suite_info>_>
                *)this_00,&local_1d8);
    suite_info::~suite_info(&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_249);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_221);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
    return;
  }
  __assert_fail("result.second",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_list.hpp"
                ,0x42,
                "void beast::unit_test::suite_list::insert(const char *, const char *, const char *, bool) [Suite = jbcoin::tests::ValidatorKeysTool_test]"
               );
}

Assistant:

void
suite_list::insert(
    char const* name,
    char const* module,
    char const* library,
    bool manual)
{
#ifndef NDEBUG
    {
        std::string s;
        s = std::string(library) + "." + module + "." + name;
        auto const result(names_.insert(s));
        BOOST_ASSERT(result.second); // Duplicate name
    }

    {
        auto const result(classes_.insert(
            std::type_index(typeid(Suite))));
        BOOST_ASSERT(result.second); // Duplicate type
    }
#endif
    cont().emplace(make_suite_info<Suite>(
        name, module, library, manual));
}